

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_Str.cpp
# Opt level: O3

void __thiscall mbc::Val::Str::~Str(Str *this)

{
  ~Str(this);
  operator_delete(this);
  return;
}

Assistant:

Str::~Str() {
    if(*count_ == 1) {
        delete value_;
    }
}